

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O0

bool __thiscall SymbolTable::symbolExists(SymbolTable *this,Identifier *symbol,int file,int section)

{
  bool bVar1;
  _Self local_70 [3];
  _Self local_58;
  iterator it;
  SymbolKey key;
  int section_local;
  int file_local;
  Identifier *symbol_local;
  SymbolTable *this_local;
  
  key.file = section;
  key.section = file;
  bVar1 = isValidSymbolName(symbol);
  if (bVar1) {
    setFileSectionValues(this,symbol,&key.section,&key.file);
    SymbolKey::SymbolKey((SymbolKey *)&it,symbol,key.section,key.file);
    local_58._M_node =
         (_Base_ptr)
         std::
         map<SymbolKey,_SymbolTable::SymbolInfo,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
         ::find(&this->symbols,(SymbolKey *)&it);
    local_70[0]._M_node =
         (_Base_ptr)
         std::
         map<SymbolKey,_SymbolTable::SymbolInfo,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
         ::end(&this->symbols);
    this_local._7_1_ = std::operator!=(&local_58,local_70);
    SymbolKey::~SymbolKey((SymbolKey *)&it);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SymbolTable::symbolExists(const Identifier& symbol, int file, int section)
{
	if (!isValidSymbolName(symbol))
		return false;

	setFileSectionValues(symbol,file,section);

	SymbolKey key = { symbol, file, section };
	auto it = symbols.find(key);
	return it != symbols.end();
}